

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextengine_p.h
# Opt level: O2

QGlyphLayout * __thiscall
QGlyphLayout::mid(QGlyphLayout *__return_storage_ptr__,QGlyphLayout *this,int position,int n)

{
  glyph_t *pgVar1;
  QFixed *pQVar2;
  QGlyphJustification *pQVar3;
  QGlyphAttributes *pQVar4;
  undefined4 uVar5;
  long lVar6;
  int iVar7;
  
  pgVar1 = this->glyphs;
  pQVar2 = this->advances;
  pQVar3 = this->justifications;
  pQVar4 = this->attributes;
  iVar7 = this->numGlyphs;
  uVar5 = *(undefined4 *)&this->field_0x2c;
  __return_storage_ptr__->offsets = this->offsets;
  __return_storage_ptr__->glyphs = pgVar1;
  __return_storage_ptr__->advances = pQVar2;
  __return_storage_ptr__->justifications = pQVar3;
  __return_storage_ptr__->attributes = pQVar4;
  __return_storage_ptr__->numGlyphs = iVar7;
  *(undefined4 *)&__return_storage_ptr__->field_0x2c = uVar5;
  lVar6 = (long)position;
  __return_storage_ptr__->glyphs = __return_storage_ptr__->glyphs + lVar6;
  __return_storage_ptr__->advances = __return_storage_ptr__->advances + lVar6;
  __return_storage_ptr__->offsets = __return_storage_ptr__->offsets + lVar6;
  __return_storage_ptr__->justifications = __return_storage_ptr__->justifications + lVar6 * 4;
  __return_storage_ptr__->attributes = __return_storage_ptr__->attributes + lVar6;
  iVar7 = __return_storage_ptr__->numGlyphs - position;
  if (n != -1) {
    iVar7 = n;
  }
  __return_storage_ptr__->numGlyphs = iVar7;
  return __return_storage_ptr__;
}

Assistant:

inline QGlyphLayout mid(int position, int n = -1) const {
        QGlyphLayout copy = *this;
        copy.glyphs += position;
        copy.advances += position;
        copy.offsets += position;
        copy.justifications += position;
        copy.attributes += position;
        if (n == -1)
            copy.numGlyphs -= position;
        else
            copy.numGlyphs = n;
        return copy;
    }